

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  char *fmt_00;
  char *pcVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  char *fmt_end;
  char *fmt_start;
  char *in_stack_ffffffffffffffb8;
  char *dst;
  char *local_8;
  
  fmt_00 = ImParseFormatFindStart(in_RDI);
  local_8 = in_RDI;
  if ((*fmt_00 == '%') && (pcVar1 = ImParseFormatFindEnd(fmt_00), local_8 = fmt_00, *pcVar1 != '\0')
     ) {
    dst = in_RSI;
    ImMin<int>(((int)pcVar1 + 1) - (int)fmt_00,in_EDX);
    ImStrncpy(dst,in_stack_ffffffffffffffb8,0x17f2b4);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt_end + 1 - fmt_start), buf_size));
    return buf;
}